

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator=
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  type pdVar4;
  size_t local_30;
  int64_t i;
  double *data;
  SquareMatrix<double> *local_18;
  SquareMatrix<double> *matrix_local;
  SquareMatrix<double> *this_local;
  
  local_18 = matrix;
  matrix_local = this;
  iVar2 = size(matrix);
  if (iVar2 != this->size_) {
    iVar2 = size(local_18);
    this->size_ = iVar2;
    alloc_unique_array<double>((dense *)&data,this->size_ * this->size_);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::operator=
              (&this->data_,(unique_ptr<double[],_std::default_delete<double[]>_> *)&data);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)&data);
  }
  pdVar3 = ptr(local_18);
  for (local_30 = 0; (long)local_30 < this->size_ * this->size_; local_30 = local_30 + 1) {
    dVar1 = pdVar3[local_30];
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->data_,local_30);
    *pdVar4 = dVar1;
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }